

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O1

jx9_value * jx9VmReserveMemObj(jx9_vm *pVm,sxu32 *pIdx)

{
  sxu32 sVar1;
  uint *puVar2;
  jx9_value *pjVar3;
  sxu32 nIdx;
  sxu32 local_14;
  
  local_14 = 0xffffffff;
  sVar1 = (pVm->aFreeObj).nUsed;
  if (sVar1 == 0) {
    puVar2 = (uint *)0x0;
  }
  else {
    sVar1 = sVar1 - 1;
    (pVm->aFreeObj).nUsed = sVar1;
    puVar2 = (uint *)((ulong)(sVar1 * (pVm->aFreeObj).eSize) + (long)(pVm->aFreeObj).pBase);
  }
  if (puVar2 == (uint *)0x0) {
    pjVar3 = (jx9_value *)0x0;
  }
  else {
    local_14 = *puVar2;
    if (local_14 < (pVm->aMemObj).nUsed) {
      pjVar3 = (jx9_value *)((ulong)((pVm->aMemObj).eSize * local_14) + (long)(pVm->aMemObj).pBase);
    }
    else {
      pjVar3 = (jx9_value *)0x0;
    }
  }
  if ((pjVar3 == (jx9_value *)0x0) &&
     (pjVar3 = VmReserveMemObj(pVm,&local_14), pjVar3 == (jx9_value *)0x0)) {
    pjVar3 = (jx9_value *)0x0;
  }
  else {
    pjVar3->pVm = (jx9_vm *)0x0;
    (pjVar3->sBlob).pAllocator = (SyMemBackend *)0x0;
    *(undefined8 *)&(pjVar3->sBlob).nFlags = 0;
    *(undefined8 *)&pjVar3->nIdx = 0;
    (pjVar3->x).rVal = 0.0;
    *(undefined8 *)&pjVar3->iFlags = 0;
    (pjVar3->sBlob).pBlob = (void *)0x0;
    (pjVar3->sBlob).nByte = 0;
    (pjVar3->sBlob).mByte = 0;
    pjVar3->pVm = pVm;
    (pjVar3->sBlob).pAllocator = &pVm->sAllocator;
    (pjVar3->sBlob).nFlags = 0;
    pjVar3->iFlags = 0x20;
    if (pIdx != (sxu32 *)0x0) {
      *pIdx = local_14;
    }
    pjVar3->nIdx = local_14;
  }
  return pjVar3;
}

Assistant:

JX9_PRIVATE jx9_value * jx9VmReserveMemObj(jx9_vm *pVm,sxu32 *pIdx)
{
	jx9_value *pObj = 0;
	VmSlot *pSlot;
	sxu32 nIdx;
	/* Check for a free slot */
	nIdx = SXU32_HIGH; /* cc warning */
	pSlot = (VmSlot *)SySetPop(&pVm->aFreeObj);
	if( pSlot ){
		pObj = (jx9_value *)SySetAt(&pVm->aMemObj, pSlot->nIdx);
		nIdx = pSlot->nIdx;
	}
	if( pObj == 0 ){
		/* Reserve a new memory object */
		pObj = VmReserveMemObj(&(*pVm), &nIdx);
		if( pObj == 0 ){
			return 0;
		}
	}
	/* Set a null default value */
	jx9MemObjInit(&(*pVm), pObj);
	if( pIdx ){
		*pIdx = nIdx;
	}
	pObj->nIdx = nIdx;
	return pObj;
}